

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
remove_value(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
             *this,int i,allocator_type *alloc)

{
  bool bVar1;
  byte bVar2;
  field_type fVar3;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar4;
  ulong local_28;
  size_type j;
  allocator_type *alloc_local;
  int i_local;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  bVar1 = leaf(this);
  if (!bVar1) {
    bVar2 = count(this);
    if (i + 1 < (int)(uint)bVar2) {
      pbVar4 = child(this,(long)(i + 1));
      fVar3 = count(pbVar4);
      if (fVar3 != '\0') {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x869,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::remove_value(const int, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      local_28 = (ulong)(i + 1);
      while( true ) {
        bVar2 = count(this);
        if (bVar2 <= local_28) break;
        pbVar4 = child(this,local_28 + 1);
        set_child(this,local_28,pbVar4);
        local_28 = local_28 + 1;
      }
      bVar2 = count(this);
      clear_child(this,(ulong)bVar2);
    }
  }
  remove_values_ignore_children(this,i,1,alloc);
  return;
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
        if (!leaf() && count() > i + 1) {
            assert(child(i + 1)->count() == 0);
            for (size_type j = i + 1; j < count(); ++j) {
                set_child(j, child(j + 1));
            }
            clear_child(count());
        }

        remove_values_ignore_children(i, /*to_erase=*/1, alloc);
    }